

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

UniquenessConstraint * __thiscall
slang::BumpAllocator::
emplace<slang::ast::UniquenessConstraint,nonstd::span_lite::span<slang::ast::Expression_const*,18446744073709551615ul>>
          (BumpAllocator *this,span<const_slang::ast::Expression_*,_18446744073709551615UL> *args)

{
  pointer ppEVar1;
  size_type sVar2;
  UniquenessConstraint *pUVar3;
  
  pUVar3 = (UniquenessConstraint *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((UniquenessConstraint *)this->endPtr < pUVar3 + 1) {
    pUVar3 = (UniquenessConstraint *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pUVar3 + 1);
  }
  ppEVar1 = args->data_;
  sVar2 = args->size_;
  (pUVar3->super_Constraint).kind = Uniqueness;
  (pUVar3->super_Constraint).syntax = (ConstraintItemSyntax *)0x0;
  (pUVar3->items).data_ = ppEVar1;
  (pUVar3->items).size_ = sVar2;
  return pUVar3;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }